

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lh_candidate_index_impl.h
# Opt level: O2

void __thiscall
lh_candidate_index::CandidateIndex::lookup
          (CandidateIndex *this,
          vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
          *histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *join_candidates,
          int il_size,double distance_threshold)

{
  int iVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer piVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  pair<int,_int> *il_entry;
  pointer __x;
  pointer piVar9;
  pointer ppVar10;
  __node_base *p_Var11;
  iterator __end2;
  int pre_cand_id;
  int current_tree_id;
  vector<int,_std::allocator<int>_> pre_candidates;
  vector<int,_std::allocator<int>_> intersection_cnt;
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  il_index;
  
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::vector(&il_index,(long)(il_size + 1),(allocator_type *)&intersection_cnt);
  current_tree_id = 0;
  std::vector<int,_std::allocator<int>_>::vector
            (&intersection_cnt,
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(histogram_collection->
                   super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&pre_candidates
            );
  ppVar2 = (histogram_collection->
           super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar10 = (histogram_collection->
                 super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppVar10 != ppVar2;
      ppVar10 = ppVar10 + 1) {
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if ((double)ppVar10->first <= distance_threshold) {
      for (pre_cand_id = 0; pre_cand_id < current_tree_id; pre_cand_id = pre_cand_id + 1) {
        std::vector<int,_std::allocator<int>_>::push_back(&pre_candidates,&pre_cand_id);
        intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[pre_cand_id] =
             intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[pre_cand_id] + 1;
      }
    }
    p_Var11 = &(ppVar10->second)._M_h._M_before_begin;
    while (piVar5 = pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish, p_Var11 = p_Var11->_M_nxt,
          p_Var11 != (__node_base *)0x0) {
      ppVar3 = il_index.
               super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var11 + 1)].
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      for (__x = il_index.
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(int)*(size_type *)(p_Var11 + 1)].
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                 _M_impl.super__Vector_impl_data._M_start; __x != ppVar3; __x = __x + 1) {
        iVar1 = *(int *)((long)(p_Var11 + 1) + 4);
        if (__x->second < iVar1) {
          iVar1 = __x->second;
        }
        lVar6 = (long)__x->first;
        iVar7 = intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        if ((iVar7 == 0) && (iVar1 != 0)) {
          std::vector<int,_std::allocator<int>_>::push_back(&pre_candidates,&__x->first);
          lVar6 = (long)__x->first;
          iVar7 = intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
        }
        iVar8 = iVar7 + iVar1;
        if (ppVar10->first < iVar7 + iVar1) {
          iVar8 = ppVar10->first;
        }
        intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar6] = iVar8;
      }
      std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                 (il_index.
                  super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + (int)*(size_type *)(p_Var11 + 1)),
                 &current_tree_id,(int *)((long)(p_Var11 + 1) + 4));
    }
    this->pre_candidates_ =
         this->pre_candidates_ +
         ((long)pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2);
    for (piVar9 = pre_candidates.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start; piVar9 != piVar5; piVar9 = piVar9 + 1) {
      pre_cand_id = *piVar9;
      lVar6 = (long)pre_cand_id;
      ppVar4 = (histogram_collection->
               super__Vector_base<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((double)((ppVar4[lVar6].first + ppVar4[current_tree_id].first +
                   intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6] * -2) / 2) <= distance_threshold) {
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)join_candidates,
                   &current_tree_id,&pre_cand_id);
        lVar6 = (long)pre_cand_id;
      }
      intersection_cnt.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start[lVar6] = 0;
    }
    current_tree_id = current_tree_id + 1;
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&pre_candidates.super__Vector_base<int,_std::allocator<int>_>);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&intersection_cnt.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~vector(&il_index);
  return;
}

Assistant:

void CandidateIndex::lookup(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection,
    std::vector<std::pair<int, int>>& join_candidates,
    const int il_size,
    const double distance_threshold) {
  // inverted list index
  std::vector<std::vector<std::pair<int, int>>> il_index(il_size+1);
  // id of the tree that is currently processed
  int current_tree_id = 0;
  // overlap count for all trees
  std::vector<int> intersection_cnt(histogram_collection.size());
  // store ids of all tree with an overlap, called pre candidates

  // iterate through all histograms in the given collection
  for (auto& histogram: histogram_collection) {
    std::vector<int> pre_candidates;

    // add all small trees that does not have to share a common label in the prefix
    if(histogram.first <= distance_threshold) {
      for(int i = 0; i < current_tree_id; ++i) {
        pre_candidates.push_back(i);
        intersection_cnt[i] += 1;
      }
    }

    for (auto& element: histogram.second) {
      for (auto& il_entry: il_index[element.first]) {
        int intersection = std::min(element.second, il_entry.second);
        if(intersection_cnt[il_entry.first] == 0 && intersection != 0)
          pre_candidates.push_back(il_entry.first);
        intersection_cnt[il_entry.first] = std::min((intersection_cnt[il_entry.first] + intersection), histogram.first);
      }
      // add current element to the index
      il_index[element.first].emplace_back(current_tree_id, element.second);
    }

    // count the number of pre canidates
    pre_candidates_ += pre_candidates.size();

    // verify all pre candidates
    for(int pre_cand_id: pre_candidates) {
      if((histogram_collection[current_tree_id].first + histogram_collection[pre_cand_id].first - 
          (2 * intersection_cnt[pre_cand_id])) / 2 <= distance_threshold)
        join_candidates.emplace_back(current_tree_id, pre_cand_id);
      // reset intersection counter
      intersection_cnt[pre_cand_id] = 0;
    }
    current_tree_id++;
  }
}